

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O3

bool __thiscall
bssl::tls13_set_traffic_key
          (bssl *this,SSL *ssl,ssl_encryption_level_t level,evp_aead_direction_t direction,
          SSL_SESSION *session,Span<const_unsigned_char> traffic_secret)

{
  pointer __p;
  long lVar1;
  string_view label;
  string_view label_00;
  Span<const_unsigned_char> fixed_iv;
  char cVar2;
  bool bVar3;
  uint16_t version;
  int iVar4;
  int iVar5;
  EVP_MD *digest;
  size_t sVar6;
  undefined4 in_register_0000000c;
  SSL_SESSION *session_00;
  ulong in_R9;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *this_00;
  Span<const_unsigned_char> secret;
  Span<const_unsigned_char> secret_00;
  Span<const_unsigned_char> enc_key;
  Span<unsigned_char> out;
  Span<unsigned_char> out_00;
  UniquePtr<SSLAEADContext> traffic_aead;
  EVP_AEAD *aead;
  size_t discard;
  uint8_t key_buf [80];
  uint8_t iv_buf [32];
  SSL_CIPHER *in_stack_fffffffffffffe88;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> local_158;
  SSL_SESSION *local_150;
  undefined4 local_148;
  ssl_encryption_level_t local_144;
  size_t local_140;
  __uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> local_138;
  __uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> local_130;
  EVP_AEAD *local_128;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_120;
  uchar *local_118;
  size_t sStack_110;
  undefined8 local_108;
  char *pcStack_100;
  undefined8 local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  size_t local_b0;
  unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> local_a8 [10];
  uchar local_58 [40];
  
  session_00 = (SSL_SESSION *)CONCAT44(in_register_0000000c,direction);
  local_148 = SUB84(ssl,0);
  local_150 = session;
  local_144 = level;
  version = ssl_session_protocol_version(session_00);
  digest = ssl_session_get_digest(session_00);
  iVar4 = SSL_is_dtls((SSL *)this);
  local_158._M_head_impl = (SSLAEADContext *)0x0;
  iVar5 = SSL_is_quic((SSL *)this);
  if (iVar5 == 0) {
    bVar3 = ssl_cipher_get_evp_aead(&local_128,&local_b0,&local_b0,session_00->cipher,version);
    if (bVar3) {
      sVar6 = EVP_AEAD_key_length(local_128);
      if (0x50 < sVar6) goto LAB_001689af;
      local_140 = EVP_AEAD_nonce_length(local_128);
      if (0x20 < local_140) goto LAB_001689af;
      local_f8 = 3;
      pcStack_f0 = "key";
      local_c8 = 0;
      uStack_c0 = 0;
      label._M_str = "key";
      label._M_len = 3;
      secret.size_ = in_R9;
      secret.data_ = (uchar *)local_150;
      out.size_ = sVar6;
      out.data_ = (uchar *)local_a8;
      bVar3 = hkdf_expand_label(out,digest,secret,label,(Span<const_unsigned_char>)ZEXT816(0),
                                iVar4 != 0);
      if (bVar3) {
        local_108 = 2;
        pcStack_100 = "iv";
        local_d8 = 0;
        uStack_d0 = 0;
        label_00._M_str = "iv";
        label_00._M_len = 2;
        secret_00.size_ = in_R9;
        secret_00.data_ = (uchar *)local_150;
        out_00.size_ = local_140;
        out_00.data_ = local_58;
        bVar3 = hkdf_expand_label(out_00,digest,secret_00,label_00,
                                  (Span<const_unsigned_char>)ZEXT816(0),iVar4 != 0);
        if (bVar3) {
          local_e8 = 0;
          uStack_e0 = 0;
          sStack_110 = local_140;
          fixed_iv.size_ = local_140;
          fixed_iv.data_ = local_58;
          enc_key.size_ = (size_t)local_a8;
          enc_key.data_ = (uchar *)session_00->cipher;
          local_118 = local_58;
          SSLAEADContext::Create
                    ((evp_aead_direction_t)&local_120,(uint16_t)local_144,
                     (SSL_CIPHER *)(ulong)session_00->ssl_version,enc_key,
                     (Span<const_unsigned_char>)ZEXT816(0),fixed_iv);
          this_00 = &local_120;
          goto LAB_001686e1;
        }
      }
    }
  }
  else {
    SSLAEADContext::CreatePlaceholderForQUIC(in_stack_fffffffffffffe88);
    this_00 = local_a8;
LAB_001686e1:
    __p = (this_00->_M_t).super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
    (this_00->_M_t).super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl = (SSLAEADContext *)0x0;
    std::__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_158,__p);
    std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr(this_00);
    if (local_158._M_head_impl != (SSLAEADContext *)0x0) {
      if (local_144 == ssl_encryption_initial) {
        local_130._M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
             (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)
             (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)local_158._M_head_impl;
        local_158._M_head_impl = (SSLAEADContext *)0x0;
        cVar2 = (**(code **)(*(long *)this + 0x98))(this,local_148,&local_130,local_150);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_130);
        if (cVar2 == '\0') goto LAB_0016898f;
        if (0x40 < in_R9) goto LAB_001689af;
        lVar1 = *(long *)(this + 0x30);
        *(undefined1 *)(lVar1 + 0x1a1) = 0;
        if (in_R9 != 0) {
          memmove((void *)(lVar1 + 0x161),local_150,in_R9);
        }
        *(char *)(lVar1 + 0x1a1) = (char)in_R9;
      }
      else {
        local_138._M_t.super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl =
             (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)
             (tuple<bssl::SSLAEADContext_*,_bssl::internal::Deleter>)local_158._M_head_impl;
        local_158._M_head_impl = (SSLAEADContext *)0x0;
        cVar2 = (**(code **)(*(long *)this + 0xa0))(this,local_148,&local_138,local_150);
        std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_138);
        if (cVar2 == '\0') goto LAB_0016898f;
        if (0x40 < in_R9) {
LAB_001689af:
          abort();
        }
        lVar1 = *(long *)(this + 0x30);
        *(undefined1 *)(lVar1 + 0x160) = 0;
        if (in_R9 != 0) {
          memmove((void *)(lVar1 + 0x120),local_150,in_R9);
        }
        *(char *)(lVar1 + 0x160) = (char)in_R9;
      }
      bVar3 = true;
      goto LAB_00168991;
    }
  }
LAB_0016898f:
  bVar3 = false;
LAB_00168991:
  std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_158);
  return bVar3;
}

Assistant:

bool tls13_set_traffic_key(SSL *ssl, enum ssl_encryption_level_t level,
                           enum evp_aead_direction_t direction,
                           const SSL_SESSION *session,
                           Span<const uint8_t> traffic_secret) {
  uint16_t version = ssl_session_protocol_version(session);
  const EVP_MD *digest = ssl_session_get_digest(session);
  bool is_dtls = SSL_is_dtls(ssl);
  UniquePtr<SSLAEADContext> traffic_aead;
  if (SSL_is_quic(ssl)) {
    // Install a placeholder SSLAEADContext so that SSL accessors work. The
    // encryption itself will be handled by the SSL_QUIC_METHOD.
    traffic_aead = SSLAEADContext::CreatePlaceholderForQUIC(session->cipher);
  } else {
    // Look up cipher suite properties.
    const EVP_AEAD *aead;
    size_t discard;
    if (!ssl_cipher_get_evp_aead(&aead, &discard, &discard, session->cipher,
                                 version)) {
      return false;
    }

    // Derive the key and IV.
    uint8_t key_buf[EVP_AEAD_MAX_KEY_LENGTH], iv_buf[EVP_AEAD_MAX_NONCE_LENGTH];
    auto key = Span(key_buf).first(EVP_AEAD_key_length(aead));
    auto iv = Span(iv_buf).first(EVP_AEAD_nonce_length(aead));
    if (!hkdf_expand_label(key, digest, traffic_secret, "key", {}, is_dtls) ||
        !hkdf_expand_label(iv, digest, traffic_secret, "iv", {}, is_dtls)) {
      return false;
    }

    traffic_aead = SSLAEADContext::Create(direction, session->ssl_version,
                                          session->cipher, key, {}, iv);
  }

  if (!traffic_aead) {
    return false;
  }

  if (direction == evp_aead_open) {
    if (!ssl->method->set_read_state(ssl, level, std::move(traffic_aead),
                                     traffic_secret)) {
      return false;
    }
    ssl->s3->read_traffic_secret.CopyFrom(traffic_secret);
  } else {
    if (!ssl->method->set_write_state(ssl, level, std::move(traffic_aead),
                                      traffic_secret)) {
      return false;
    }
    ssl->s3->write_traffic_secret.CopyFrom(traffic_secret);
  }

  return true;
}